

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

ModsqrtContext * modsqrt_new(mp_int *p,mp_int *any_nonsquare_mod_p)

{
  BignumInt *__src;
  ulong uVar1;
  ModsqrtContext *pMVar2;
  mp_int *pmVar3;
  MontyContext *pMVar4;
  mp_int *r;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong bits;
  
  pMVar2 = (ModsqrtContext *)safemalloc(1,0x38,0);
  pMVar2->p = (mp_int *)0x0;
  pMVar2->mc = (MontyContext *)0x0;
  pMVar2->e = 0;
  pMVar2->k = (mp_int *)0x0;
  pMVar2->km1o2 = (mp_int *)0x0;
  pMVar2->z = (mp_int *)0x0;
  pMVar2->zk = (mp_int *)0x0;
  __src = p->w;
  pmVar3 = mp_make_sized(p->nw);
  memcpy(pmVar3->w,__src,pmVar3->nw << 3);
  pMVar2->p = pmVar3;
  pMVar4 = monty_new(pmVar3);
  pMVar2->mc = pMVar4;
  pmVar3 = mp_modmul(any_nonsquare_mod_p,pMVar4->powers_of_r_mod_m[0],pMVar4->m);
  pMVar2->z = pmVar3;
  uVar1 = p->nw;
  uVar5 = uVar1 << 6;
  bits = 1;
  if (uVar5 != 0) {
    uVar8 = 1;
    do {
      if (uVar8 >> 6 < uVar1) {
        uVar6 = p->w[uVar8 >> 6];
      }
      else {
        uVar6 = 0;
      }
      bits = uVar8;
    } while (((uVar6 >> (uVar8 & 0x3f) & 1) == 0) &&
            (uVar8 = uVar8 + 1, bits = uVar5, uVar5 != uVar8));
  }
  lVar7 = 0;
  if (bits >> 6 <= uVar1) {
    lVar7 = uVar1 - (bits >> 6);
  }
  pMVar2->e = bits;
  pmVar3 = mp_make_sized(lVar7 + (ulong)(lVar7 == 0));
  mp_rshift_fixed_into(pmVar3,p,bits);
  pMVar2->k = pmVar3;
  r = mp_make_sized(pmVar3->nw + (ulong)(pmVar3->nw == 0));
  mp_rshift_fixed_into(r,pmVar3,1);
  pMVar2->km1o2 = r;
  return pMVar2;
}

Assistant:

ModsqrtContext *modsqrt_new(mp_int *p, mp_int *any_nonsquare_mod_p)
{
    ModsqrtContext *sc = snew(ModsqrtContext);
    memset(sc, 0, sizeof(ModsqrtContext));

    sc->p = mp_copy(p);
    sc->mc = monty_new(sc->p);
    sc->z = monty_import(sc->mc, any_nonsquare_mod_p);

    /* Find the lowest set bit in p-1. Since this routine expects p to
     * be non-secret (typically a well-known standard elliptic curve
     * parameter), for once we don't need clever bit tricks. */
    for (sc->e = 1; sc->e < BIGNUM_INT_BITS * p->nw; sc->e++)
        if (mp_get_bit(p, sc->e))
            break;

    sc->k = mp_rshift_fixed(p, sc->e);
    sc->km1o2 = mp_rshift_fixed(sc->k, 1);

    /* Leave zk to be filled in lazily, since it's more expensive to
     * compute. If this context turns out never to be needed, we can
     * save the bulk of the setup time this way. */

    return sc;
}